

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int * __thiscall PrimitiveTestClass::FillValues<int*>(PrimitiveTestClass *this)

{
  int *piVar1;
  size_t i;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)this->SIZE;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = lVar3 * 4;
  }
  piVar1 = (int *)operator_new__(uVar4);
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    piVar1[lVar2] = 0xff;
  }
  return piVar1;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }